

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O0

void __thiscall
nnad::FeedForwardNN<double>::FeedForwardNN
          (FeedForwardNN<double> *this,vector<int,_std::allocator<int>_> *Arch,int *RandomSeed,
          bool *Report,function<double_(const_double_&)> *ActFun,
          function<double_(const_double_&)> *dActFun,OutputFunction *OutputFunc,
          Preprocessing *Preproc,vector<double,_std::allocator<double>_> *PreprocPars)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  byte *in_RCX;
  uint *in_RDX;
  vector<int,_std::allocator<int>_> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_nnad::Matrix<double>_>_>,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>,_bool> pVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>,_bool>
  pVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar10;
  undefined4 *in_stack_00000008;
  int *n;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<double,_std::allocator<double>_> OutPrep;
  int i_1;
  vector<double,_std::allocator<double>_> InPrep;
  string name_1;
  coordinates coord_1;
  int j;
  string name;
  coordinates coord;
  int i;
  int l_2;
  int count;
  int l_1;
  int iseed;
  int l;
  vector<int,_std::allocator<int>_> sub_seeds;
  int nl;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff838;
  pair<const_int,_nnad::Matrix<double>_> *in_stack_fffffffffffff840;
  value_type *in_stack_fffffffffffff848;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
  *in_stack_fffffffffffff850;
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  *in_stack_fffffffffffff858;
  function<double_(const_double_&)> *in_stack_fffffffffffff860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff880;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff888;
  Matrix<double> *in_stack_fffffffffffff890;
  allocator<char> local_579;
  string local_578 [32];
  reference local_558;
  int *local_550;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_548 [2];
  allocator<char> local_531;
  string local_530 [32];
  vector<double,_std::allocator<double>_> local_510;
  double local_4f8;
  int local_4ec;
  _Base_ptr local_4c8;
  undefined1 local_4c0;
  int local_4b4;
  _Base_ptr local_488;
  undefined1 local_480;
  _Base_ptr local_448;
  undefined1 local_440;
  pair<const_int,_std::tuple<bool,_int,_int,_int>_> local_434;
  _Base_ptr local_420;
  undefined1 local_418;
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [32];
  string local_368 [32];
  string local_348 [32];
  string local_328 [32];
  string local_308 [35];
  undefined1 local_2e5;
  tuple<bool,_int,_int,_int> local_2e4;
  int local_2d4;
  _Base_ptr local_2d0;
  undefined1 local_2c8;
  int local_2bc;
  _Base_ptr local_290;
  undefined1 local_288;
  _Base_ptr local_250;
  undefined1 local_248;
  pair<const_int,_std::tuple<bool,_int,_int,_int>_> local_23c;
  _Base_ptr local_228;
  undefined1 local_220;
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [36];
  undefined4 local_14c;
  undefined1 local_145;
  tuple<bool,_int,_int,_int> local_144;
  int local_134;
  int local_130;
  int local_12c;
  _Base_ptr local_128;
  undefined1 local_120;
  undefined4 local_114;
  _Base_ptr local_c8;
  undefined1 local_c0;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_40;
  byte *local_20;
  uint *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff890,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff888);
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff850,
             (function<double_(const_double_&)> *)in_stack_fffffffffffff848);
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff850,
             (function<double_(const_double_&)> *)in_stack_fffffffffffff848);
  *(undefined4 *)
   &in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *in_stack_00000008;
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::function((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
              *)in_stack_fffffffffffff850,
             (function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
              *)in_stack_fffffffffffff848);
  bVar1 = std::operator==((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                           *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  if (bVar1) {
    memset(&in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish,0,0x18);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10854a);
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff890,
               in_stack_fffffffffffff888);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)
                     &in_RDI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  *(int *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = (int)sVar3;
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff840);
  std::function<double_(const_double_&)>::function
            ((function<double_(const_double_&)> *)in_stack_fffffffffffff840);
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::map((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
         *)0x1085d3);
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::map((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
         *)0x1085ef);
  std::
  map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
  ::map((map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
         *)0x10860b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
         *)0x108627);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)0x108643);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10865f);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
  local_40 = (int)sVar3;
  srand(*local_18);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10868f);
  for (local_5c = 1; local_5c < local_40; local_5c = local_5c + 1) {
    local_60 = rand();
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840,
               (value_type_conflict2 *)in_stack_fffffffffffff838);
    local_64 = rand();
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840,
               (value_type_conflict2 *)in_stack_fffffffffffff838);
  }
  *(undefined4 *)
   &in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = 0;
  local_68 = 0;
  for (local_6c = 1; local_6c < local_40; local_6c = local_6c + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_6c);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)(local_6c + -1));
    local_68 = local_68 + 1;
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840,
               (size_type)in_stack_fffffffffffff838);
    Matrix<double>::Matrix
              (in_stack_fffffffffffff890,(int *)in_stack_fffffffffffff888,
               (int *)in_stack_fffffffffffff880,(int *)in_stack_fffffffffffff878);
    std::pair<const_int,_nnad::Matrix<double>_>::pair<int_&,_nnad::Matrix<double>,_true>
              (in_stack_fffffffffffff840,(int *)in_stack_fffffffffffff838,(Matrix<double> *)0x10887f
              );
    pVar6 = std::
            map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
            ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                      *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
    local_c8 = (_Base_ptr)pVar6.first._M_node;
    local_c0 = pVar6.second;
    std::pair<const_int,_nnad::Matrix<double>_>::~pair
              ((pair<const_int,_nnad::Matrix<double>_> *)0x1088d2);
    Matrix<double>::~Matrix((Matrix<double> *)0x1088df);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_6c);
    local_114 = 1;
    local_68 = local_68 + 1;
    std::vector<int,_std::allocator<int>_>::at
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840,
               (size_type)in_stack_fffffffffffff838);
    Matrix<double>::Matrix
              (in_stack_fffffffffffff890,(int *)in_stack_fffffffffffff888,
               (int *)in_stack_fffffffffffff880,(int *)in_stack_fffffffffffff878);
    std::pair<const_int,_nnad::Matrix<double>_>::pair<int_&,_nnad::Matrix<double>,_true>
              (in_stack_fffffffffffff840,(int *)in_stack_fffffffffffff838,(Matrix<double> *)0x108986
              );
    pVar6 = std::
            map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
            ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                      *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
    local_128 = (_Base_ptr)pVar6.first._M_node;
    local_120 = pVar6.second;
    std::pair<const_int,_nnad::Matrix<double>_>::~pair
              ((pair<const_int,_nnad::Matrix<double>_> *)0x1089d9);
    Matrix<double>::~Matrix((Matrix<double> *)0x1089e6);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_6c);
    iVar2 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)(local_6c + -1));
    *(int *)&in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish =
         iVar2 * (*pvVar4 + 1) +
         *(int *)&in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
  }
  local_12c = 0;
  local_130 = local_40;
  while (local_130 = local_130 + -1, 0 < local_130) {
    for (local_134 = 0; iVar2 = local_134,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)local_130),
        iVar2 < *pvVar4; local_134 = local_134 + 1) {
      local_145 = 0;
      local_14c = 0;
      std::make_tuple<bool,int&,int&,int>
                ((bool *)in_stack_fffffffffffff858,(int *)in_stack_fffffffffffff850,
                 (int *)in_stack_fffffffffffff848,&in_stack_fffffffffffff840->first);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff888 >> 0x20));
      std::operator+((char *)in_stack_fffffffffffff848,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff840);
      std::operator+(&in_stack_fffffffffffff848->first,(char *)in_stack_fffffffffffff840);
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff888 >> 0x20));
      std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_1b0);
      std::__cxx11::string::~string(local_1d0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::pair<int_&,_true>((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                           *)in_stack_fffffffffffff850,&in_stack_fffffffffffff848->first,
                          &in_stack_fffffffffffff840->first);
      pVar7 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
      local_228 = (_Base_ptr)pVar7.first._M_node;
      local_220 = pVar7.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)0x108cd9);
      std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>::pair<int_&,_true>
                (&local_23c,&local_12c,&local_144);
      pVar8 = std::
              map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
              ::insert((map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
                        *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
      local_250 = (_Base_ptr)pVar8.first._M_node;
      local_248 = pVar8.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_true>
                (in_stack_fffffffffffff850,&in_stack_fffffffffffff848->first,
                 (tuple<bool,_int,_int,_int> *)in_stack_fffffffffffff840);
      pVar9 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
              ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
                        *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
      local_290 = (_Base_ptr)pVar9.first._M_node;
      local_288 = pVar9.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
               *)0x108dd8);
      local_2bc = local_12c;
      local_12c = local_12c + 1;
      std::
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_true>((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_fffffffffffff840,(int *)in_stack_fffffffffffff838,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x108e24);
      pVar10 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::insert((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
      local_2d0 = (_Base_ptr)pVar10.first._M_node;
      local_2c8 = pVar10.second;
      std::
      pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x108e77);
      for (local_2d4 = 0; iVar2 = local_2d4,
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)(local_130 + -1))
          , iVar2 < *pvVar4; local_2d4 = local_2d4 + 1) {
        local_2e5 = 1;
        std::make_tuple<bool,int&,int&,int&>
                  ((bool *)in_stack_fffffffffffff858,(int *)in_stack_fffffffffffff850,
                   (int *)in_stack_fffffffffffff848,&in_stack_fffffffffffff840->first);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff888 >> 0x20));
        std::operator+((char *)in_stack_fffffffffffff848,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff840);
        std::operator+(&in_stack_fffffffffffff848->first,(char *)in_stack_fffffffffffff840);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff888 >> 0x20));
        std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        std::operator+(&in_stack_fffffffffffff848->first,(char *)in_stack_fffffffffffff840);
        std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff888 >> 0x20));
        std::operator+(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::~string(local_328);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::string::~string(local_3c8);
        std::__cxx11::string::~string(local_368);
        std::__cxx11::string::~string(local_388);
        std::__cxx11::string::~string(local_3a8);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::pair<int_&,_true>((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                             *)in_stack_fffffffffffff850,&in_stack_fffffffffffff848->first,
                            &in_stack_fffffffffffff840->first);
        pVar7 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
        local_420 = (_Base_ptr)pVar7.first._M_node;
        local_418 = pVar7.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)0x1090ae);
        std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>::pair<int_&,_true>
                  (&local_434,&local_12c,&local_2e4);
        pVar8 = std::
                map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
                ::insert((map<int,_std::tuple<bool,_int,_int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::tuple<bool,_int,_int,_int>_>_>_>
                          *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
        local_448 = (_Base_ptr)pVar8.first._M_node;
        local_440 = pVar8.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
        ::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_true>
                  (in_stack_fffffffffffff850,&in_stack_fffffffffffff848->first,
                   (tuple<bool,_int,_int,_int> *)in_stack_fffffffffffff840);
        pVar9 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
                ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>_>_>
                          *)in_stack_fffffffffffff850,in_stack_fffffffffffff848);
        local_488 = (_Base_ptr)pVar9.first._M_node;
        local_480 = pVar9.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
                 *)0x1091ad);
        local_4b4 = local_12c;
        local_12c = local_12c + 1;
        std::
        pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<int,_true>((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)in_stack_fffffffffffff840,(int *)in_stack_fffffffffffff838,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          0x1091f9);
        pVar10 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::insert((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
        local_4c8 = (_Base_ptr)pVar10.first._M_node;
        local_4c0 = pVar10.second;
        std::
        pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x10924c);
        std::__cxx11::string::~string(local_308);
      }
      std::__cxx11::string::~string(local_170);
    }
  }
  iVar2 = *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  if (iVar2 == 0) {
    std::function<double_(const_double_&)>::operator=
              (in_stack_fffffffffffff860,
               (function<double_(const_double_&)> *)in_stack_fffffffffffff858);
    std::function<double_(const_double_&)>::operator=
              (in_stack_fffffffffffff860,
               (function<double_(const_double_&)> *)in_stack_fffffffffffff858);
  }
  else if (iVar2 == 1) {
    std::function<double(double_const&)>::operator=
              (in_stack_fffffffffffff860,(anon_class_1_0_00000001 *)in_stack_fffffffffffff858);
    std::function<double(double_const&)>::operator=
              (in_stack_fffffffffffff860,(anon_class_1_0_00000001 *)in_stack_fffffffffffff858);
  }
  else if (iVar2 == 2) {
    std::function<double(double_const&)>::operator=
              (in_stack_fffffffffffff860,(anon_class_1_0_00000001 *)in_stack_fffffffffffff858);
    std::function<double(double_const&)>::operator=
              (in_stack_fffffffffffff860,(anon_class_1_0_00000001 *)in_stack_fffffffffffff858);
  }
  bVar1 = std::operator!=((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                           *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x109673);
    for (local_4ec = 0; iVar2 = local_4ec,
        pvVar4 = std::vector<int,_std::allocator<int>_>::front
                           ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840),
        iVar2 < *pvVar4; local_4ec = local_4ec + 1) {
      iVar2 = rand();
      local_4f8 = (double)(iVar2 % 100) * 0.01;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff840,
                 (value_type_conflict1 *)in_stack_fffffffffffff838);
    }
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()(in_stack_fffffffffffff858,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff848);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_510);
    iVar2 = *(int *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    pvVar4 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff840);
    if ((int)sVar3 != (iVar2 + 1) * *pvVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                 (allocator<char> *)in_stack_fffffffffffff870);
      Error((string *)0x1097e4);
      std::__cxx11::string::~string(local_530);
      std::allocator<char>::~allocator(&local_531);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff850);
  }
  if ((*local_20 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\nFeed-forward neural network initialised:");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"- architecture = [ ");
    local_548[0]._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffff838);
    local_550 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffff838);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff840,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff838), bVar1) {
      local_558 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(local_548);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*local_558);
      std::operator<<(poVar5," ");
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (local_548);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar1 = std::operator!=((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                             *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"- preprocessing function provided");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "- number of parameters (NN + preprocessing) = ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)&in_RDI[9].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
      poVar5 = std::operator<<(poVar5," + ");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
      poVar5 = std::operator<<(poVar5," (");
      poVar5 = (ostream *)
               std::ostream::operator<<
                         (poVar5,*(int *)&in_RDI[9].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish +
                                 *(int *)&in_RDI[6].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
      in_stack_fffffffffffff880 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(poVar5,")");
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff880,std::endl<char,std::char_traits<char>>);
    }
    else {
      in_stack_fffffffffffff878 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)&std::cout,"- number of parameters = ");
      in_stack_fffffffffffff870 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::ostream::operator<<
                     ((ostream *)in_stack_fffffffffffff878,
                      *(int *)&in_RDI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff870,std::endl<char,std::char_traits<char>>);
    }
    std::operator<<((ostream *)&std::cout,"- NN output function: ");
    iVar2 = *(int *)&in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
    if (iVar2 == 0) {
      poVar5 = std::operator<<((ostream *)&std::cout,"activation-like");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else if (iVar2 == 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"linear");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else if (iVar2 == 2) {
      in_stack_fffffffffffff850 =
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<bool,_int,_int,_int>_>
            *)std::operator<<((ostream *)&std::cout,"quadratic");
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff850,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"unknown");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                 (allocator<char> *)in_stack_fffffffffffff870);
      Error((string *)0x109c7b);
      std::__cxx11::string::~string(local_578);
      std::allocator<char>::~allocator(&local_579);
    }
    std::operator<<((ostream *)&std::cout,"\n");
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff850);
  return;
}

Assistant:

FeedForwardNN(std::vector<int>           const& Arch,
                  int                        const& RandomSeed,
                  bool                       const& Report = false,
                  std::function<T(T const&)> const& ActFun = Sigmoid<T>,
                  std::function<T(T const&)> const& dActFun = dSigmoid<T>,
                  OutputFunction             const& OutputFunc = LINEAR,
                  Preprocessing              const& Preproc = nullptr,
                  std::vector<T>             const& PreprocPars = {}):
      _Arch(Arch),
      _ActFun(ActFun),
      _dActFun(dActFun),
      _OutputFunc(OutputFunc),
      _Preproc(Preproc),
      _PreprocPars(_Preproc == nullptr ? std::vector<T> {} : PreprocPars),
      _NpPrep((int) _PreprocPars.size())
    {
      // Number of layers
      const int nl = (int) _Arch.size();

      // Store sub seeds
      srand(RandomSeed);
      std::vector<int> sub_seeds;
      for (int l = 1; l < nl; l++)
        {
          sub_seeds.push_back(rand());
          sub_seeds.push_back(rand());
        }

      // Number of parameters of the NN
      _Np = 0;

      // Initialise links and biases with random numbers. Links are
      // treated as matrices that connect consecutive layers with as
      // many rows as nodes of the rightmost layer and as many columns
      // as the leftmost layer. Biases are treated as one-column
      // matrices associated to each layer (but the input one) with as
      // many rows as nodes.
      int iseed = 0;
      for (int l = 1; l < nl; l++)
        {
          _Links.insert({l, Matrix<T>{_Arch[l], _Arch[l - 1], sub_seeds.at(iseed++)}});
          _Biases.insert({l, Matrix<T>{_Arch[l], 1, sub_seeds.at(iseed++)}});
          _Np += _Arch[l] * (_Arch[l - 1] + 1);
        }

      // Construct maps that index the free parameters. Each parameter is
      // associated to an integer and a string.
      int count = 0;
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            const coordinates coord = std::make_tuple(false, l, i, 0);
            const std::string name = "B_" + std::to_string(l) + "_" + std::to_string(i);
            _StrIntMap.insert({name, count});
            _IntMap.insert({count, coord});
            _StrMap.insert({name, coord});
            _IntStrMap.insert({count++, name});

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              {
                const coordinates coord = std::make_tuple(true, l, i, j);
                const std::string name = "L_" + std::to_string(l) + "_" + std::to_string(i) + "_" + std::to_string(j);
                _StrIntMap.insert({name, count});
                _IntMap.insert({count, coord});
                _StrMap.insert({name, coord});
                _IntStrMap.insert({count++, name});
              }
          }

      // Define activation function of the output nodes and its
      // derivative.
      switch (_OutputFunc)
        {
        case ACTIVATION:
          _OutputActFun  = _ActFun;
          _dOutputActFun = _dActFun;
          break;
        case LINEAR:
          _OutputActFun  = [] (T const& x) -> T { return x; };
          _dOutputActFun = [] (T const&)   -> T { return T{1}; };
          break;
        case QUADRATIC:
          _OutputActFun  = [] (T const& x) -> T { return x * x; };
          _dOutputActFun = [] (T const& x) -> T { return 2 * x; };
          break;
        }

      // Check sanity of preprocessing function, if present
      if (_Preproc != nullptr)
        {
          // Generate random inputs between 0 and 1 but recasted as T
          std::vector<T> InPrep;
          for (int i = 0; i < _Arch.front(); i++)
            InPrep.push_back(T{1e-2 * ( rand() % 100 )});

          // Test preprocessing function
          const std::vector<T> OutPrep = _Preproc(InPrep, _PreprocPars);

          // Check that the number of outputs of the preprocessing
          // function is the same as that of the NN.
          if ((int) OutPrep.size() != ( _NpPrep + 1 ) * _Arch.back())
            Error("FeedForwardNN: preprocessing function not well-formed.");
        }

      // Report NN parameters
      if (Report)
        {
          std::cout << "\nFeed-forward neural network initialised:" << std::endl;
          std::cout << "- architecture = [ ";
          for (auto const& n : _Arch)
            std::cout << n << " ";
          std::cout << "]" << std::endl;
          if (_Preproc != nullptr)
            {
              std::cout << "- preprocessing function provided" << std::endl;
              std::cout << "- number of parameters (NN + preprocessing) = " << _Np << " + " << _NpPrep << " (" << _Np + _NpPrep << ")" << std::endl;
            }
          else
            std::cout << "- number of parameters = " << _Np << std::endl;
          std::cout << "- NN output function: ";
          switch (_OutputFunc)
            {
            case ACTIVATION:
              std::cout << "activation-like" << std::endl;
              break;
            case LINEAR:
              std::cout << "linear" << std::endl;
              break;
            case QUADRATIC:
              std::cout << "quadratic" << std::endl;
              break;
            default:
              std::cout << "unknown" << std::endl;
              Error("FeedForwardNN: Unknown output function.");
            }
          std::cout << "\n";
        }
    }